

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall
Args::HelpHasBeenPrintedException::HelpHasBeenPrintedException(HelpHasBeenPrintedException *this)

{
  undefined8 *in_RDI;
  allocator *what;
  BaseException *in_stack_ffffffffffffffc0;
  allocator local_29;
  string local_28 [40];
  
  what = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Help has been printed.",what);
  BaseException::BaseException(in_stack_ffffffffffffffc0,(String *)what);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *in_RDI = &PTR__HelpHasBeenPrintedException_001bd528;
  return;
}

Assistant:

HelpHasBeenPrintedException()
		:	BaseException( SL( "Help has been printed." ) )
	{
	}